

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

int Mvc_UtilsCheckUnusedZeros(Mvc_Cover_t *pCover)

{
  uint uVar1;
  uint local_24;
  Mvc_Cube_t *pMStack_20;
  int nCubes;
  Mvc_Cube_t *pCube;
  uint Unsigned;
  Mvc_Cover_t *pCover_local;
  
  local_24 = 0;
  for (pMStack_20 = (pCover->lCubes).pHead; pMStack_20 != (Mvc_Cube_t *)0x0;
      pMStack_20 = pMStack_20->pNext) {
    if ((*(uint *)&pMStack_20->field_0x8 >> 0x18 & 0x3f) != 0) {
      if ((pMStack_20->pData[*(uint *)&pMStack_20->field_0x8 & 0xffffff] &
          -1 << (0x20 - ((byte)((uint)*(undefined4 *)&pMStack_20->field_0x8 >> 0x18) & 0x3f) & 0x1f)
          ) != 0) {
        uVar1 = Mvc_CoverReadCubeNum(pCover);
        printf("Cube %2d out of %2d contains dirty bits.\n",(ulong)local_24,(ulong)uVar1);
      }
      local_24 = local_24 + 1;
    }
  }
  return 1;
}

Assistant:

int Mvc_UtilsCheckUnusedZeros( Mvc_Cover_t * pCover )
{
    unsigned Unsigned;
    Mvc_Cube_t * pCube;
    int nCubes;

    nCubes = 0;
    Mvc_CoverForEachCube( pCover, pCube )
    {
        if ( pCube->nUnused == 0 )
            continue;

        Unsigned = ( pCube->pData[pCube->iLast] & 
                    (BITS_FULL << (32-pCube->nUnused)) );
        if( Unsigned )
        {
            printf( "Cube %2d out of %2d contains dirty bits.\n", nCubes, 
                Mvc_CoverReadCubeNum(pCover) );
        }
        nCubes++;
    }
    return 1;
}